

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

void __thiscall QFSFileEngine::QFSFileEngine(QFSFileEngine *this,QString *file)

{
  QAbstractFileEnginePrivate *pQVar1;
  QFSFileEnginePrivate *this_00;
  long in_FS_OFFSET;
  QFileSystemEntry local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine =
       (_func_int **)&PTR__QFSFileEngine_001884f0;
  this_00 = (QFSFileEnginePrivate *)operator_new(200);
  QFSFileEnginePrivate::QFSFileEnginePrivate(this_00,&this->super_QAbstractFileEngine);
  QAbstractFileEngine::QAbstractFileEngine
            (&this->super_QAbstractFileEngine,(QAbstractFileEnginePrivate *)this_00);
  (this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine =
       (_func_int **)&PTR__QFSFileEngine_001884f0;
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  QFileSystemEntry::QFileSystemEntry(&local_60,file);
  QFileSystemEntry::operator=((QFileSystemEntry *)(pQVar1 + 1),&local_60);
  QFileSystemEntry::~QFileSystemEntry(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFSFileEngine::QFSFileEngine(const QString &file)
    : QAbstractFileEngine(*new QFSFileEnginePrivate(this))
{
    Q_D(QFSFileEngine);
    d->fileEntry = QFileSystemEntry(file);
}